

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O0

void __thiscall diffusion::NetReader::~NetReader(NetReader *this)

{
  element_type *this_00;
  NetReader *this_local;
  
  (this->super_Reader)._vptr_Reader = (_func_int **)&PTR_can_read_00175bf8;
  this_00 = std::__shared_ptr_access<diffusion::Receiver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<diffusion::Receiver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->receiver_);
  Receiver::shut_down(this_00);
  std::thread::join();
  Tokenizer::~Tokenizer(&this->data_queue_);
  std::thread::~thread(&this->receiver_thread_);
  std::shared_ptr<diffusion::Receiver>::~shared_ptr(&this->receiver_);
  Reader::~Reader(&this->super_Reader);
  return;
}

Assistant:

NetReader::~NetReader() {
    receiver_->shut_down();
    receiver_thread_.join();
}